

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O1

int erkStep_ComputeSolutions(ARKodeMem ark_mem,sunrealtype *dsmPtr)

{
  ARKodeERKStepMem step_mem;
  N_Vector p_Var1;
  sunrealtype *psVar2;
  N_Vector *pp_Var3;
  sunrealtype *psVar4;
  sunrealtype *psVar5;
  sunrealtype *psVar6;
  sunrealtype *psVar7;
  ARKodeButcherTable pAVar8;
  sunrealtype *psVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  sunrealtype sVar14;
  int local_3c;
  N_Vector local_38;
  
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeERKStepMem)0x0) {
    iVar11 = -0x15;
    arkProcessError(ark_mem,-0x15,0x58c,"erkStep_ComputeSolutions",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    p_Var1 = ark_mem->ycur;
    local_38 = ark_mem->tempv1;
    psVar2 = step_mem->cvals;
    pp_Var3 = step_mem->Xvecs;
    *dsmPtr = 0.0;
    iVar11 = step_mem->stages;
    lVar13 = (long)iVar11;
    lVar12 = 0;
    if (0 < lVar13) {
      do {
        psVar2[lVar12] = ark_mem->h * step_mem->B->b[lVar12];
        pp_Var3[lVar12] = step_mem->F[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar13 != lVar12);
    }
    local_3c = (int)lVar12;
    psVar2[local_3c] = 1.0;
    pp_Var3[local_3c] = ark_mem->yn;
    local_3c = local_3c + 1;
    if (0 < step_mem->nforcing) {
      if (0 < iVar11) {
        psVar4 = step_mem->stage_times;
        psVar5 = step_mem->B->c;
        psVar6 = step_mem->B->b;
        psVar7 = step_mem->stage_coefs;
        lVar12 = 0;
        do {
          psVar4[lVar12] = psVar5[lVar12] * ark_mem->h + ark_mem->tn;
          psVar7[lVar12] = ark_mem->h * psVar6[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar13 != lVar12);
      }
      erkStep_ApplyForcing(step_mem,step_mem->stage_times,step_mem->stage_coefs,iVar11,&local_3c);
    }
    iVar10 = N_VLinearCombination(local_3c,psVar2,pp_Var3,p_Var1);
    iVar11 = -0x1c;
    if (iVar10 == 0) {
      if ((ark_mem->fixedstep == 0) || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)) {
        iVar11 = step_mem->stages;
        lVar13 = (long)iVar11;
        lVar12 = 0;
        if (0 < lVar13) {
          do {
            psVar2[lVar12] = (step_mem->B->b[lVar12] - step_mem->B->d[lVar12]) * ark_mem->h;
            pp_Var3[lVar12] = step_mem->F[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar13 != lVar12);
        }
        local_3c = (int)lVar12;
        if (0 < step_mem->nforcing) {
          if (0 < iVar11) {
            pAVar8 = step_mem->B;
            psVar4 = step_mem->stage_times;
            psVar5 = pAVar8->c;
            psVar6 = pAVar8->b;
            psVar7 = pAVar8->d;
            psVar9 = step_mem->stage_coefs;
            lVar12 = 0;
            do {
              psVar4[lVar12] = psVar5[lVar12] * ark_mem->h + ark_mem->tn;
              psVar9[lVar12] = (psVar6[lVar12] - psVar7[lVar12]) * ark_mem->h;
              lVar12 = lVar12 + 1;
            } while (lVar13 != lVar12);
          }
          erkStep_ApplyForcing
                    (step_mem,step_mem->stage_times,step_mem->stage_coefs,iVar11,&local_3c);
        }
        p_Var1 = local_38;
        iVar11 = N_VLinearCombination(local_3c,psVar2,pp_Var3,local_38);
        if (iVar11 != 0) {
          return -0x1c;
        }
        sVar14 = (sunrealtype)N_VWrmsNorm(p_Var1,ark_mem->ewt);
        *dsmPtr = sVar14;
      }
      iVar11 = 0;
    }
  }
  return iVar11;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, sunrealtype* dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  sunrealtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ERKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;

  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j = 0; j < step_mem->stages; j++)
  {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /* apply external polynomial forcing */
  if (step_mem->nforcing > 0)
  {
    for (j = 0; j < step_mem->stages; j++)
    {
      step_mem->stage_times[j] = ark_mem->tn + step_mem->B->c[j] * ark_mem->h;
      step_mem->stage_coefs[j] = ark_mem->h * step_mem->B->b[j];
    }
    erkStep_ApplyForcing(step_mem, step_mem->stage_times, step_mem->stage_coefs,
                         step_mem->stages, &nvec);
  }

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* Compute yerr (if step adaptivity or error accumulation enabled) */
  if (!ark_mem->fixedstep || (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE))
  {
    /* set arrays for fused vector operation */
    nvec = 0;
    for (j = 0; j < step_mem->stages; j++)
    {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* apply external polynomial forcing */
    if (step_mem->nforcing > 0)
    {
      for (j = 0; j < step_mem->stages; j++)
      {
        step_mem->stage_times[j] = ark_mem->tn + step_mem->B->c[j] * ark_mem->h;
        step_mem->stage_coefs[j] = ark_mem->h *
                                   (step_mem->B->b[j] - step_mem->B->d[j]);
      }
      erkStep_ApplyForcing(step_mem, step_mem->stage_times,
                           step_mem->stage_coefs, step_mem->stages, &nvec);
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return (ARK_SUCCESS);
}